

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O1

bool embree::sse2::ConeCurveMiMBIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  Geometry *pGVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  long lVar24;
  RTCIntersectArguments *pRVar25;
  RTCRayN *pRVar26;
  RTCFilterFunctionN p_Var27;
  long lVar28;
  Scene *pSVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  ulong uVar33;
  bool bVar34;
  bool bVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar57;
  float fVar58;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar70;
  float fVar71;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar80;
  uint uVar81;
  float fVar84;
  uint uVar85;
  float fVar86;
  uint uVar87;
  float fVar88;
  uint uVar89;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar90;
  float fVar91;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar100;
  float fVar101;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  uint uVar112;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar113;
  float fVar114;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar124;
  float fVar128;
  float fVar129;
  undefined1 auVar125 [16];
  float fVar130;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar131;
  float fVar132;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar142;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar143 [16];
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar163 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar168 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<4> hit;
  undefined8 local_378;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined8 local_338;
  undefined8 uStack_330;
  Scene *local_320;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  RTCFilterFunctionNArguments local_2e8;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  size_t local_268;
  Primitive *local_260;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  uint local_208;
  uint uStack_204;
  uint uStack_200;
  uint uStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined1 local_158 [16];
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  uint local_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  uint local_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8 [4];
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  
  local_320 = context->scene;
  uVar36 = (line->v0).field_0.i[0];
  pGVar20 = (local_320->geometries).items[line->sharedGeomID].ptr;
  fVar57 = pGVar20->fnumTimeSegments;
  fVar41 = (pGVar20->time_range).lower;
  fVar40 = ((*(float *)(ray + k * 4 + 0x70) - fVar41) / ((pGVar20->time_range).upper - fVar41)) *
           fVar57;
  fVar41 = floorf(fVar40);
  fVar57 = fVar57 + -1.0;
  if (fVar57 <= fVar41) {
    fVar41 = fVar57;
  }
  fVar57 = 0.0;
  if (0.0 <= fVar41) {
    fVar57 = fVar41;
  }
  lVar31 = *(long *)&pGVar20[3].time_range.upper;
  lVar32 = (long)(int)fVar57 * 0x38;
  lVar24 = *(long *)(lVar31 + lVar32);
  lVar28 = *(long *)(lVar31 + 0x10 + lVar32);
  pfVar1 = (float *)(lVar24 + lVar28 * (ulong)uVar36);
  uVar37 = (line->v0).field_0.i[1];
  pfVar2 = (float *)(lVar24 + lVar28 * (ulong)uVar37);
  uVar38 = (line->v0).field_0.i[2];
  pfVar3 = (float *)(lVar24 + lVar28 * (ulong)uVar38);
  uVar39 = (line->v0).field_0.i[3];
  pfVar4 = (float *)(lVar24 + lVar28 * (ulong)uVar39);
  pfVar5 = (float *)(lVar24 + lVar28 * (ulong)(uVar36 + 1));
  pfVar6 = (float *)(lVar24 + lVar28 * (ulong)(uVar37 + 1));
  pfVar7 = (float *)(lVar24 + lVar28 * (ulong)(uVar38 + 1));
  local_b8[0] = pfVar7[2];
  pfVar8 = (float *)(lVar24 + lVar28 * (ulong)(uVar39 + 1));
  lVar24 = *(long *)(lVar31 + 0x38 + lVar32);
  lVar31 = *(long *)(lVar31 + 0x48 + lVar32);
  pfVar9 = (float *)(lVar24 + (ulong)uVar36 * lVar31);
  pfVar10 = (float *)(lVar24 + (ulong)uVar37 * lVar31);
  pfVar11 = (float *)(lVar24 + (ulong)uVar38 * lVar31);
  pfVar12 = (float *)(lVar24 + (ulong)uVar39 * lVar31);
  pfVar13 = (float *)(lVar24 + (ulong)(uVar36 + 1) * lVar31);
  pfVar14 = (float *)(lVar24 + (ulong)(uVar38 + 1) * lVar31);
  fVar40 = fVar40 - fVar57;
  pfVar15 = (float *)(lVar24 + (ulong)(uVar37 + 1) * lVar31);
  lVar31 = lVar31 * (ulong)(uVar39 + 1);
  pfVar16 = (float *)(lVar24 + lVar31);
  fVar57 = 1.0 - fVar40;
  fVar131 = *pfVar1 * fVar57 + *pfVar9 * fVar40;
  fVar136 = *pfVar2 * fVar57 + *pfVar10 * fVar40;
  fVar138 = *pfVar3 * fVar57 + *pfVar11 * fVar40;
  fVar140 = *pfVar4 * fVar57 + *pfVar12 * fVar40;
  fVar151 = pfVar1[1] * fVar57 + pfVar9[1] * fVar40;
  fVar154 = pfVar2[1] * fVar57 + pfVar10[1] * fVar40;
  fVar157 = pfVar3[1] * fVar57 + pfVar11[1] * fVar40;
  fVar160 = pfVar4[1] * fVar57 + pfVar12[1] * fVar40;
  local_1e8 = pfVar1[2] * fVar57 + pfVar9[2] * fVar40;
  fStack_1e4 = pfVar2[2] * fVar57 + pfVar10[2] * fVar40;
  fStack_1e0 = pfVar3[2] * fVar57 + pfVar11[2] * fVar40;
  fStack_1dc = pfVar4[2] * fVar57 + pfVar12[2] * fVar40;
  fVar113 = pfVar1[3] * fVar57 + pfVar9[3] * fVar40;
  fVar118 = pfVar2[3] * fVar57 + pfVar10[3] * fVar40;
  fVar120 = pfVar3[3] * fVar57 + pfVar11[3] * fVar40;
  fVar122 = pfVar4[3] * fVar57 + pfVar12[3] * fVar40;
  fVar90 = *pfVar5 * fVar57 + *pfVar13 * fVar40;
  fVar94 = *pfVar6 * fVar57 + *pfVar15 * fVar40;
  fVar96 = *pfVar7 * fVar57 + *pfVar14 * fVar40;
  fVar98 = *pfVar8 * fVar57 + *pfVar16 * fVar40;
  fVar80 = pfVar5[1] * fVar57 + pfVar13[1] * fVar40;
  fVar84 = pfVar6[1] * fVar57 + pfVar15[1] * fVar40;
  fVar86 = pfVar7[1] * fVar57 + pfVar14[1] * fVar40;
  fVar88 = pfVar8[1] * fVar57 + pfVar16[1] * fVar40;
  fStack_350 = (float)_local_358;
  fStack_34c = (float)((ulong)_local_358 >> 0x20);
  fVar100 = pfVar5[2] * fVar57 + pfVar13[2] * fVar40;
  fVar106 = pfVar6[2] * fVar57 + pfVar15[2] * fVar40;
  fVar108 = fStack_350 * fVar57 + pfVar14[2] * fVar40;
  fVar110 = fStack_34c * fVar57 + pfVar16[2] * fVar40;
  fVar70 = fVar57 * pfVar5[3] + fVar40 * pfVar13[3];
  fVar74 = fVar57 * pfVar6[3] + fVar40 * pfVar15[3];
  fVar76 = fVar57 * pfVar7[3] + fVar40 * pfVar14[3];
  fVar78 = fVar57 * pfVar8[3] + fVar40 * pfVar16[3];
  local_b8[1] = local_b8[0];
  local_b8[2] = local_b8[0];
  local_b8[3] = local_b8[0];
  local_308 = *(float *)(ray + k * 4 + 0x40);
  fVar57 = *(float *)(ray + k * 4 + 0x50);
  fVar41 = *(float *)(ray + k * 4 + 0x60);
  auVar92._0_4_ = local_308 * local_308 + fVar57 * fVar57 + fVar41 * fVar41;
  auVar92._4_4_ = auVar92._0_4_;
  auVar92._8_4_ = auVar92._0_4_;
  auVar92._12_4_ = auVar92._0_4_;
  auVar125 = rcpps(ZEXT416((uint)(fVar41 * fVar41)),auVar92);
  fVar142 = auVar125._0_4_;
  fVar144 = auVar125._4_4_;
  fVar145 = auVar125._8_4_;
  fVar146 = auVar125._12_4_;
  fVar40 = *(float *)(ray + k * 4 + 0x10);
  fVar150 = *(float *)(ray + k * 4 + 0x20);
  fVar111 = *(float *)(ray + k * 4);
  local_248 = (((fVar131 + fVar90) * 0.5 - fVar111) * local_308 +
              ((fVar151 + fVar80) * 0.5 - fVar40) * fVar57 +
              ((local_1e8 + fVar100) * 0.5 - fVar150) * fVar41) *
              ((1.0 - auVar92._0_4_ * fVar142) * fVar142 + fVar142);
  fStack_244 = (((fVar136 + fVar94) * 0.5 - fVar111) * local_308 +
               ((fVar154 + fVar84) * 0.5 - fVar40) * fVar57 +
               ((fStack_1e4 + fVar106) * 0.5 - fVar150) * fVar41) *
               ((1.0 - auVar92._0_4_ * fVar144) * fVar144 + fVar144);
  fStack_240 = (((fVar138 + fVar96) * 0.5 - fVar111) * local_308 +
               ((fVar157 + fVar86) * 0.5 - fVar40) * fVar57 +
               ((fStack_1e0 + fVar108) * 0.5 - fVar150) * fVar41) *
               ((1.0 - auVar92._0_4_ * fVar145) * fVar145 + fVar145);
  fStack_23c = (((fVar140 + fVar98) * 0.5 - fVar111) * local_308 +
               ((fVar160 + fVar88) * 0.5 - fVar40) * fVar57 +
               ((fStack_1dc + fVar110) * 0.5 - fVar150) * fVar41) *
               ((1.0 - auVar92._0_4_ * fVar146) * fVar146 + fVar146);
  fVar101 = local_308 * local_248 + fVar111;
  fVar107 = local_308 * fStack_244 + fVar111;
  fVar109 = local_308 * fStack_240 + fVar111;
  fVar111 = local_308 * fStack_23c + fVar111;
  fVar42 = fVar57 * local_248 + fVar40;
  fVar52 = fVar57 * fStack_244 + fVar40;
  fVar54 = fVar57 * fStack_240 + fVar40;
  fVar40 = fVar57 * fStack_23c + fVar40;
  fVar147 = fVar41 * local_248 + fVar150;
  fVar148 = fVar41 * fStack_244 + fVar150;
  fVar149 = fVar41 * fStack_240 + fVar150;
  fVar150 = fVar41 * fStack_23c + fVar150;
  local_1d8 = fVar90 - fVar131;
  fStack_1d4 = fVar94 - fVar136;
  fStack_1d0 = fVar96 - fVar138;
  fStack_1cc = fVar98 - fVar140;
  fVar131 = fVar101 - fVar131;
  fVar136 = fVar107 - fVar136;
  fVar138 = fVar109 - fVar138;
  fVar140 = fVar111 - fVar140;
  fVar142 = fVar80 - fVar151;
  fVar144 = fVar84 - fVar154;
  fVar145 = fVar86 - fVar157;
  fVar146 = fVar88 - fVar160;
  fVar151 = fVar42 - fVar151;
  fVar154 = fVar52 - fVar154;
  fVar157 = fVar54 - fVar157;
  fVar160 = fVar40 - fVar160;
  fVar152 = fVar100 - local_1e8;
  fVar155 = fVar106 - fStack_1e4;
  fVar158 = fVar108 - fStack_1e0;
  fVar161 = fVar110 - fStack_1dc;
  local_1e8 = fVar147 - local_1e8;
  fStack_1e4 = fVar148 - fStack_1e4;
  fStack_1e0 = fVar149 - fStack_1e0;
  fStack_1dc = fVar150 - fStack_1dc;
  fVar58 = local_1d8 * local_1d8 + fVar142 * fVar142 + fVar152 * fVar152;
  fVar67 = fStack_1d4 * fStack_1d4 + fVar144 * fVar144 + fVar155 * fVar155;
  fVar68 = fStack_1d0 * fStack_1d0 + fVar145 * fVar145 + fVar158 * fVar158;
  fVar69 = fStack_1cc * fStack_1cc + fVar146 * fVar146 + fVar161 * fVar161;
  fVar43 = local_1d8 * fVar131 + fVar142 * fVar151 + fVar152 * local_1e8;
  fVar53 = fStack_1d4 * fVar136 + fVar144 * fVar154 + fVar155 * fStack_1e4;
  fVar55 = fStack_1d0 * fVar138 + fVar145 * fVar157 + fVar158 * fStack_1e0;
  fVar56 = fStack_1cc * fVar140 + fVar146 * fVar160 + fVar161 * fStack_1dc;
  fVar153 = local_1d8 * local_308 + fVar142 * fVar57 + fVar152 * fVar41;
  fVar156 = fStack_1d4 * local_308 + fVar144 * fVar57 + fVar155 * fVar41;
  fVar159 = fStack_1d0 * local_308 + fVar145 * fVar57 + fVar158 * fVar41;
  fVar162 = fStack_1cc * local_308 + fVar146 * fVar57 + fVar161 * fVar41;
  fVar114 = fVar113 - fVar70;
  fVar119 = fVar118 - fVar74;
  fVar121 = fVar120 - fVar76;
  fVar123 = fVar122 - fVar78;
  fVar132 = fVar114 * fVar114 + fVar58;
  fVar137 = fVar119 * fVar119 + fVar67;
  fVar139 = fVar121 * fVar121 + fVar68;
  fVar141 = fVar123 * fVar123 + fVar69;
  local_c8 = fVar58 * fVar58;
  fStack_c4 = fVar67 * fVar67;
  fStack_c0 = fVar68 * fVar68;
  fStack_bc = fVar69 * fVar69;
  fVar71 = fVar153 * fVar153;
  fVar75 = fVar156 * fVar156;
  fVar77 = fVar159 * fVar159;
  fVar79 = fVar162 * fVar162;
  auVar163._0_4_ = local_c8 - fVar132 * fVar71;
  auVar163._4_4_ = fStack_c4 - fVar137 * fVar75;
  auVar163._8_4_ = fStack_c0 - fVar139 * fVar77;
  auVar163._12_4_ = fStack_bc - fVar141 * fVar79;
  fVar91 = fVar113 * fVar58;
  fVar95 = fVar118 * fVar67;
  fVar97 = fVar120 * fVar68;
  fVar99 = fVar122 * fVar69;
  fVar164 = fVar114 * fVar153 * fVar91 +
            ((local_308 * fVar131 + fVar57 * fVar151 + fVar41 * local_1e8) * local_c8 -
            fVar153 * fVar43 * fVar132);
  fVar165 = fVar119 * fVar156 * fVar95 +
            ((local_308 * fVar136 + fVar57 * fVar154 + fVar41 * fStack_1e4) * fStack_c4 -
            fVar156 * fVar53 * fVar137);
  fVar166 = fVar121 * fVar159 * fVar97 +
            ((local_308 * fVar138 + fVar57 * fVar157 + fVar41 * fStack_1e0) * fStack_c0 -
            fVar159 * fVar55 * fVar139);
  fVar167 = fVar123 * fVar162 * fVar99 +
            ((local_308 * fVar140 + fVar57 * fVar160 + fVar41 * fStack_1dc) * fStack_bc -
            fVar162 * fVar56 * fVar141);
  auVar116._0_4_ =
       fVar164 * fVar164 -
       (((fVar114 + fVar114) * fVar43 - fVar91) * fVar91 +
       ((fVar131 * fVar131 + fVar151 * fVar151 + local_1e8 * local_1e8) * local_c8 -
       fVar43 * fVar43 * fVar132)) * auVar163._0_4_;
  auVar116._4_4_ =
       fVar165 * fVar165 -
       (((fVar119 + fVar119) * fVar53 - fVar95) * fVar95 +
       ((fVar136 * fVar136 + fVar154 * fVar154 + fStack_1e4 * fStack_1e4) * fStack_c4 -
       fVar53 * fVar53 * fVar137)) * auVar163._4_4_;
  auVar116._8_4_ =
       fVar166 * fVar166 -
       (((fVar121 + fVar121) * fVar55 - fVar97) * fVar97 +
       ((fVar138 * fVar138 + fVar157 * fVar157 + fStack_1e0 * fStack_1e0) * fStack_c0 -
       fVar55 * fVar55 * fVar139)) * auVar163._8_4_;
  auVar116._12_4_ =
       fVar167 * fVar167 -
       (((fVar123 + fVar123) * fVar56 - fVar99) * fVar99 +
       ((fVar140 * fVar140 + fVar160 * fVar160 + fStack_1dc * fStack_1dc) * fStack_bc -
       fVar56 * fVar56 * fVar141)) * auVar163._12_4_;
  auVar125._0_4_ =
       ~-(uint)((line->primIDs).field_0.i[0] == 0xffffffff) & -(uint)(0.0 <= auVar116._0_4_);
  auVar125._4_4_ =
       ~-(uint)((line->primIDs).field_0.i[1] == 0xffffffff) & -(uint)(0.0 <= auVar116._4_4_);
  auVar125._8_4_ =
       ~-(uint)((line->primIDs).field_0.i[2] == 0xffffffff) & -(uint)(0.0 <= auVar116._8_4_);
  auVar125._12_4_ =
       ~-(uint)((line->primIDs).field_0.i[3] == 0xffffffff) & -(uint)(0.0 <= auVar116._12_4_);
  lVar24 = (ulong)line->leftExists * 0x10;
  lVar28 = (ulong)line->rightExists * 0x10;
  iVar30 = movmskps((int)lVar31,auVar125);
  if (iVar30 != 0) {
    fVar101 = fVar101 - fVar90;
    fVar107 = fVar107 - fVar94;
    fVar109 = fVar109 - fVar96;
    fVar111 = fVar111 - fVar98;
    fVar42 = fVar42 - fVar80;
    fVar52 = fVar52 - fVar84;
    fVar54 = fVar54 - fVar86;
    fVar40 = fVar40 - fVar88;
    auVar115._0_4_ = fVar142 * fVar42;
    auVar115._4_4_ = fVar144 * fVar52;
    auVar115._8_4_ = fVar145 * fVar54;
    auVar115._12_4_ = fVar146 * fVar40;
    fVar147 = fVar147 - fVar100;
    fVar148 = fVar148 - fVar106;
    fVar149 = fVar149 - fVar108;
    fVar150 = fVar150 - fVar110;
    fVar124 = fVar152 * fVar147 + auVar115._0_4_ + local_1d8 * fVar101;
    fVar128 = fVar155 * fVar148 + auVar115._4_4_ + fStack_1d4 * fVar107;
    fVar129 = fVar158 * fVar149 + auVar115._8_4_ + fStack_1d0 * fVar109;
    fVar130 = fVar161 * fVar150 + auVar115._12_4_ + fStack_1cc * fVar111;
    auVar92 = sqrtps(auVar116,auVar116);
    auVar116 = rcpps(auVar115,auVar163);
    fVar80 = auVar116._0_4_;
    fVar84 = auVar116._4_4_;
    fVar86 = auVar116._8_4_;
    fVar88 = auVar116._12_4_;
    fVar80 = (1.0 - auVar163._0_4_ * fVar80) * fVar80 + fVar80;
    fVar84 = (1.0 - auVar163._4_4_ * fVar84) * fVar84 + fVar84;
    fVar86 = (1.0 - auVar163._8_4_ * fVar86) * fVar86 + fVar86;
    fVar88 = (1.0 - auVar163._12_4_ * fVar88) * fVar88 + fVar88;
    uVar36 = -(uint)(1e-18 < ABS(auVar163._0_4_));
    uVar37 = -(uint)(1e-18 < ABS(auVar163._4_4_));
    uVar38 = -(uint)(1e-18 < ABS(auVar163._8_4_));
    uVar39 = -(uint)(1e-18 < ABS(auVar163._12_4_));
    fVar90 = (float)(~uVar36 & 0xff800000 | (uint)((-fVar164 - auVar92._0_4_) * fVar80) & uVar36);
    fVar91 = (float)(~uVar37 & 0xff800000 | (uint)((-fVar165 - auVar92._4_4_) * fVar84) & uVar37);
    fVar94 = (float)(~uVar38 & 0xff800000 | (uint)((-fVar166 - auVar92._8_4_) * fVar86) & uVar38);
    fVar95 = (float)(~uVar39 & 0xff800000 | (uint)((-fVar167 - auVar92._12_4_) * fVar88) & uVar39);
    fVar80 = (float)(~uVar36 & 0x7f800000 | (uint)((auVar92._0_4_ - fVar164) * fVar80) & uVar36);
    fVar84 = (float)(~uVar37 & 0x7f800000 | (uint)((auVar92._4_4_ - fVar165) * fVar84) & uVar37);
    fVar86 = (float)(~uVar38 & 0x7f800000 | (uint)((auVar92._8_4_ - fVar166) * fVar86) & uVar38);
    fVar88 = (float)(~uVar39 & 0x7f800000 | (uint)((auVar92._12_4_ - fVar167) * fVar88) & uVar39);
    fVar100 = fVar153 * fVar90 + fVar43;
    fVar106 = fVar156 * fVar91 + fVar53;
    fVar108 = fVar159 * fVar94 + fVar55;
    fVar110 = fVar162 * fVar95 + fVar56;
    uVar36 = -(uint)(0.0 < fVar100 && fVar100 < fVar58) & auVar125._0_4_;
    uVar37 = -(uint)(0.0 < fVar106 && fVar106 < fVar67) & auVar125._4_4_;
    uVar38 = -(uint)(0.0 < fVar108 && fVar108 < fVar68) & auVar125._8_4_;
    uVar39 = -(uint)(0.0 < fVar110 && fVar110 < fVar69) & auVar125._12_4_;
    auVar133._0_4_ = (uint)fVar90 & uVar36;
    auVar133._4_4_ = (uint)fVar91 & uVar37;
    auVar133._8_4_ = (uint)fVar94 & uVar38;
    auVar133._12_4_ = (uint)fVar95 & uVar39;
    auVar117._0_8_ = CONCAT44(~uVar37,~uVar36) & 0x7f8000007f800000;
    auVar117._8_4_ = ~uVar38 & 0x7f800000;
    auVar117._12_4_ = ~uVar39 & 0x7f800000;
    _local_218 = auVar117 | auVar133;
    local_258 = fVar153 * fVar80 + fVar43;
    fStack_254 = fVar156 * fVar84 + fVar53;
    fStack_250 = fVar159 * fVar86 + fVar55;
    fStack_24c = fVar162 * fVar88 + fVar56;
    auVar59._4_4_ = -(uint)(0.0 < fStack_254);
    auVar59._0_4_ = -(uint)(0.0 < local_258);
    auVar59._8_4_ = -(uint)(0.0 < fStack_250);
    auVar59._12_4_ = -(uint)(0.0 < fStack_24c);
    uVar36 = -(uint)(local_258 < fVar58 && 0.0 < local_258) & auVar125._0_4_;
    uVar37 = -(uint)(fStack_254 < fVar67 && 0.0 < fStack_254) & auVar125._4_4_;
    uVar38 = -(uint)(fStack_250 < fVar68 && 0.0 < fStack_250) & auVar125._8_4_;
    uVar39 = -(uint)(fStack_24c < fVar69 && 0.0 < fStack_24c) & auVar125._12_4_;
    auVar168._0_4_ = (uint)fVar80 & uVar36;
    auVar168._4_4_ = (uint)fVar84 & uVar37;
    auVar168._8_4_ = (uint)fVar86 & uVar38;
    auVar168._12_4_ = (uint)fVar88 & uVar39;
    auVar143._0_8_ = CONCAT44(~uVar37,~uVar36) & 0xff800000ff800000;
    auVar143._8_4_ = ~uVar38 & 0xff800000;
    auVar143._12_4_ = ~uVar39 & 0xff800000;
    _local_2b8 = auVar143 | auVar168;
    auVar22._4_4_ = fVar156;
    auVar22._0_4_ = fVar153;
    auVar22._8_4_ = fVar159;
    auVar22._12_4_ = fVar162;
    auVar92 = rcpps(auVar59,auVar22);
    fVar80 = auVar92._0_4_;
    fVar86 = auVar92._4_4_;
    fVar90 = auVar92._8_4_;
    fVar94 = auVar92._12_4_;
    fVar80 = (1.0 - fVar153 * fVar80) * fVar80 + fVar80;
    fVar86 = (1.0 - fVar156 * fVar86) * fVar86 + fVar86;
    fVar90 = (1.0 - fVar159 * fVar90) * fVar90 + fVar90;
    fVar94 = (1.0 - fVar162 * fVar94) * fVar94 + fVar94;
    fVar96 = fVar153 * fVar131 - local_308 * fVar43;
    fVar97 = fVar156 * fVar136 - local_308 * fVar53;
    fVar98 = fVar159 * fVar138 - local_308 * fVar55;
    fVar99 = fVar162 * fVar140 - local_308 * fVar56;
    fVar84 = fVar153 * fVar151 - fVar57 * fVar43;
    fVar88 = fVar156 * fVar154 - fVar57 * fVar53;
    fVar91 = fVar159 * fVar157 - fVar57 * fVar55;
    fVar95 = fVar162 * fVar160 - fVar57 * fVar56;
    fVar164 = fVar153 * local_1e8 - fVar41 * fVar43;
    fVar165 = fVar156 * fStack_1e4 - fVar41 * fVar53;
    fVar166 = fVar159 * fStack_1e0 - fVar41 * fVar55;
    fVar167 = fVar162 * fStack_1dc - fVar41 * fVar56;
    uVar36 = -(uint)(fVar113 * fVar113 * fVar71 <=
                    fVar96 * fVar96 + fVar84 * fVar84 + fVar164 * fVar164);
    uVar37 = -(uint)(fVar118 * fVar118 * fVar75 <=
                    fVar97 * fVar97 + fVar88 * fVar88 + fVar165 * fVar165);
    uVar38 = -(uint)(fVar120 * fVar120 * fVar77 <=
                    fVar98 * fVar98 + fVar91 * fVar91 + fVar166 * fVar166);
    uVar39 = -(uint)(fVar122 * fVar122 * fVar79 <=
                    fVar99 * fVar99 + fVar95 * fVar95 + fVar167 * fVar167);
    local_358 = (float)*(undefined8 *)(mm_lookupmask_ps + lVar24);
    fStack_354 = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar24) >> 0x20);
    fStack_350 = (float)*(undefined8 *)(mm_lookupmask_ps + lVar24 + 8);
    fStack_34c = (float)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar24 + 8) >> 0x20);
    auVar93._0_4_ =
         (uVar36 & 0x7f800000 | ~uVar36 & (uint)(-fVar43 * fVar80)) &
         ~(uint)local_358 & auVar125._0_4_;
    auVar93._4_4_ =
         (uVar37 & 0x7f800000 | ~uVar37 & (uint)(-fVar53 * fVar86)) &
         ~(uint)fStack_354 & auVar125._4_4_;
    auVar93._8_4_ =
         (uVar38 & 0x7f800000 | ~uVar38 & (uint)(-fVar55 * fVar90)) &
         ~(uint)fStack_350 & auVar125._8_4_;
    auVar93._12_4_ =
         (uVar39 & 0x7f800000 | ~uVar39 & (uint)(-fVar56 * fVar94)) &
         ~(uint)fStack_34c & auVar125._12_4_;
    auVar72._0_8_ =
         CONCAT44(~(~(uint)fStack_354 & auVar125._4_4_),~(~(uint)local_358 & auVar125._0_4_)) &
         0x7f8000007f800000;
    auVar72._8_4_ = ~(~(uint)fStack_350 & auVar125._8_4_) & 0x7f800000;
    auVar72._12_4_ = ~(~(uint)fStack_34c & auVar125._12_4_) & 0x7f800000;
    auVar72 = auVar72 | auVar93;
    fVar43 = fVar101 * fVar153 - local_308 * fVar124;
    fVar53 = fVar107 * fVar156 - local_308 * fVar128;
    fVar55 = fVar109 * fVar159 - local_308 * fVar129;
    fVar111 = fVar111 * fVar162 - local_308 * fVar130;
    fVar42 = fVar42 * fVar153 - fVar57 * fVar124;
    fVar52 = fVar52 * fVar156 - fVar57 * fVar128;
    fVar54 = fVar54 * fVar159 - fVar57 * fVar129;
    fVar56 = fVar40 * fVar162 - fVar57 * fVar130;
    fVar84 = fVar147 * fVar153 - fVar41 * fVar124;
    fVar88 = fVar148 * fVar156 - fVar41 * fVar128;
    fVar91 = fVar149 * fVar159 - fVar41 * fVar129;
    fVar150 = fVar150 * fVar162 - fVar41 * fVar130;
    fVar40 = *(float *)(ray + k * 4 + 0x30);
    local_2a8._0_4_ = (undefined4)*(undefined8 *)(mm_lookupmask_ps + lVar28);
    local_2a8._4_4_ = (undefined4)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar28) >> 0x20);
    local_2a8._8_4_ = (undefined4)*(undefined8 *)(mm_lookupmask_ps + lVar28 + 8);
    local_2a8._12_4_ = (undefined4)((ulong)*(undefined8 *)(mm_lookupmask_ps + lVar28 + 8) >> 0x20);
    uVar36 = -(uint)(fVar70 * fVar70 * fVar71 <= fVar43 * fVar43 + fVar42 * fVar42 + fVar84 * fVar84
                    );
    uVar37 = -(uint)(fVar74 * fVar74 * fVar75 <= fVar53 * fVar53 + fVar52 * fVar52 + fVar88 * fVar88
                    );
    uVar38 = -(uint)(fVar76 * fVar76 * fVar77 <= fVar55 * fVar55 + fVar54 * fVar54 + fVar91 * fVar91
                    );
    uVar39 = -(uint)(fVar78 * fVar78 * fVar79 <=
                    fVar111 * fVar111 + fVar56 * fVar56 + fVar150 * fVar150);
    auVar102._0_4_ =
         (uVar36 & 0x7f800000 | ~uVar36 & (uint)(-fVar124 * fVar80)) &
         ~local_2a8._0_4_ & auVar125._0_4_;
    auVar102._4_4_ =
         (uVar37 & 0x7f800000 | ~uVar37 & (uint)(-fVar128 * fVar86)) &
         ~local_2a8._4_4_ & auVar125._4_4_;
    auVar102._8_4_ =
         (uVar38 & 0x7f800000 | ~uVar38 & (uint)(-fVar129 * fVar90)) &
         ~local_2a8._8_4_ & auVar125._8_4_;
    auVar102._12_4_ =
         (uVar39 & 0x7f800000 | ~uVar39 & (uint)(-fVar130 * fVar94)) &
         ~local_2a8._12_4_ & auVar125._12_4_;
    auVar44._0_8_ =
         CONCAT44(~(~local_2a8._4_4_ & auVar125._4_4_),~(~local_2a8._0_4_ & auVar125._0_4_)) &
         0x7f8000007f800000;
    auVar44._8_4_ = ~(~local_2a8._8_4_ & auVar125._8_4_) & 0x7f800000;
    auVar44._12_4_ = ~(~local_2a8._12_4_ & auVar125._12_4_) & 0x7f800000;
    auVar92 = minps(auVar72,auVar44 | auVar102);
    auVar116 = maxps(auVar72,auVar44 | auVar102);
    auVar163 = minps(_local_218,auVar92);
    fVar70 = auVar163._0_4_;
    fVar71 = auVar163._4_4_;
    fVar74 = auVar163._8_4_;
    fVar75 = auVar163._12_4_;
    fVar111 = auVar92._0_4_;
    fVar42 = auVar92._4_4_;
    fVar43 = auVar92._8_4_;
    fVar52 = auVar92._12_4_;
    uVar36 = -(uint)(auVar116._0_4_ != INFINITY);
    uVar37 = -(uint)(auVar116._4_4_ != INFINITY);
    uVar38 = -(uint)(auVar116._8_4_ != INFINITY);
    uVar39 = -(uint)(auVar116._12_4_ != INFINITY);
    fVar150 = *(float *)(ray + k * 4 + 0x80);
    auVar103._0_4_ =
         (~-(uint)(fVar111 != INFINITY) & 0xff800000 | (uint)fVar111 & -(uint)(fVar111 != INFINITY))
         & -(uint)(fVar70 != fVar111);
    auVar103._4_4_ =
         (~-(uint)(fVar42 != INFINITY) & 0xff800000 | (uint)fVar42 & -(uint)(fVar42 != INFINITY)) &
         -(uint)(fVar71 != fVar42);
    auVar103._8_4_ =
         (~-(uint)(fVar43 != INFINITY) & 0xff800000 | (uint)fVar43 & -(uint)(fVar43 != INFINITY)) &
         -(uint)(fVar74 != fVar43);
    auVar103._12_4_ =
         (~-(uint)(fVar52 != INFINITY) & 0xff800000 | (uint)fVar52 & -(uint)(fVar52 != INFINITY)) &
         -(uint)(fVar75 != fVar52);
    auVar126._0_4_ =
         ~-(uint)(fVar70 != fVar111) & (~uVar36 & 0xff800000 | (uint)auVar116._0_4_ & uVar36);
    auVar126._4_4_ =
         ~-(uint)(fVar71 != fVar42) & (~uVar37 & 0xff800000 | (uint)auVar116._4_4_ & uVar37);
    auVar126._8_4_ =
         ~-(uint)(fVar74 != fVar43) & (~uVar38 & 0xff800000 | (uint)auVar116._8_4_ & uVar38);
    auVar126._12_4_ =
         ~-(uint)(fVar75 != fVar52) & (~uVar39 & 0xff800000 | (uint)auVar116._12_4_ & uVar39);
    _local_48 = maxps(_local_2b8,auVar126 | auVar103);
    local_208 = -(uint)((fVar40 <= local_248 + fVar70 && local_248 + fVar70 <= fVar150) &&
                       fVar70 != INFINITY);
    uStack_204 = -(uint)((fVar40 <= fStack_244 + fVar71 && fStack_244 + fVar71 <= fVar150) &&
                        fVar71 != INFINITY);
    uStack_200 = -(uint)((fVar40 <= fStack_240 + fVar74 && fStack_240 + fVar74 <= fVar150) &&
                        fVar74 != INFINITY);
    uStack_1fc = -(uint)((fVar40 <= fStack_23c + fVar75 && fStack_23c + fVar75 <= fVar150) &&
                        fVar75 != INFINITY);
    fVar53 = local_48._0_4_;
    fVar111 = local_248 + fVar53;
    fVar54 = local_48._4_4_;
    fVar42 = fStack_244 + fVar54;
    fVar55 = local_48._8_4_;
    fVar43 = fStack_240 + fVar55;
    fVar56 = local_48._12_4_;
    fVar52 = fStack_23c + fVar56;
    uVar37 = local_208 & auVar125._0_4_;
    uVar38 = uStack_204 & auVar125._4_4_;
    auVar60._4_4_ = uVar38;
    auVar60._0_4_ = uVar37;
    uVar39 = uStack_200 & auVar125._8_4_;
    uVar112 = uStack_1fc & auVar125._12_4_;
    local_2a8._0_4_ =
         -(uint)(fVar53 != -INFINITY) & auVar125._0_4_ &
         -(uint)(fVar111 <= fVar150 && fVar40 <= fVar111);
    local_2a8._4_4_ =
         -(uint)(fVar54 != -INFINITY) & auVar125._4_4_ &
         -(uint)(fVar42 <= fVar150 && fVar40 <= fVar42);
    local_2a8._8_4_ =
         -(uint)(fVar55 != -INFINITY) & auVar125._8_4_ &
         -(uint)(fVar43 <= fVar150 && fVar40 <= fVar43);
    local_2a8._12_4_ =
         -(uint)(fVar56 != -INFINITY) & auVar125._12_4_ &
         -(uint)(fVar52 <= fVar150 && fVar40 <= fVar52);
    auVar60._8_4_ = uVar39;
    auVar60._12_4_ = uVar112;
    uVar36 = movmskps((int)lVar24,auVar60 | local_2a8);
    if (uVar36 != 0) {
      fVar76 = (float)((uint)fVar70 & uVar37 | ~uVar37 & (uint)fVar53);
      fVar77 = (float)((uint)fVar71 & uVar38 | ~uVar38 & (uint)fVar54);
      fVar74 = (float)((uint)fVar74 & uVar39 | ~uVar39 & (uint)fVar55);
      fVar75 = (float)((uint)fVar75 & uVar112 | ~uVar112 & (uint)fVar56);
      auVar61._0_4_ = (uint)fVar100 & uVar37;
      auVar61._4_4_ = (uint)fVar106 & uVar38;
      auVar61._8_4_ = (uint)fVar108 & uVar39;
      auVar61._12_4_ = (uint)fVar110 & uVar112;
      auVar104._0_4_ = ~uVar37 & (uint)local_258;
      auVar104._4_4_ = ~uVar38 & (uint)fStack_254;
      auVar104._8_4_ = ~uVar39 & (uint)fStack_250;
      auVar104._12_4_ = ~uVar112 & (uint)fStack_24c;
      auVar104 = auVar104 | auVar61;
      auVar23._4_4_ = fVar67;
      auVar23._0_4_ = fVar58;
      auVar23._8_4_ = fVar68;
      auVar23._12_4_ = fVar69;
      auVar92 = rcpps(auVar61,auVar23);
      fVar40 = auVar92._0_4_;
      fVar150 = auVar92._4_4_;
      fVar53 = auVar92._8_4_;
      fVar54 = auVar92._12_4_;
      fVar40 = (1.0 - fVar58 * fVar40) * fVar40 + fVar40;
      fVar150 = (1.0 - fVar67 * fVar150) * fVar150 + fVar150;
      fVar53 = (1.0 - fVar68 * fVar53) * fVar53 + fVar53;
      fVar54 = (1.0 - fVar69 * fVar54) * fVar54 + fVar54;
      fVar113 = fVar113 * fVar114 * fVar58;
      fVar118 = fVar118 * fVar119 * fVar67;
      fVar120 = fVar120 * fVar121 * fVar68;
      fVar122 = fVar122 * fVar123 * fVar69;
      local_228 = fVar142 * fVar113;
      fStack_224 = fVar144 * fVar118;
      fStack_220 = fVar145 * fVar120;
      fStack_21c = fVar146 * fVar122;
      fVar67 = fVar113 * fVar152;
      fVar68 = fVar118 * fVar155;
      fVar69 = fVar120 * fVar158;
      fVar70 = fVar122 * fVar161;
      local_1f8 = fVar132 * fVar152;
      fStack_1f4 = fVar137 * fVar155;
      fStack_1f0 = fVar139 * fVar158;
      fStack_1ec = fVar141 * fVar161;
      uVar81 = -(uint)(fVar76 == local_2b8._0_4_ || fVar76 == local_218._0_4_) & auVar125._0_4_;
      uVar85 = -(uint)(fVar77 == local_2b8._4_4_ || fVar77 == local_218._4_4_) & auVar125._4_4_;
      uVar87 = -(uint)(fVar74 == local_2b8._8_4_ || fVar74 == local_218._8_4_) & auVar125._8_4_;
      uVar89 = -(uint)(fVar75 == local_2b8._12_4_ || fVar75 == local_218._12_4_) & auVar125._12_4_;
      local_358 = auVar72._0_4_;
      fStack_354 = auVar72._4_4_;
      fStack_350 = auVar72._8_4_;
      fStack_34c = auVar72._12_4_;
      uVar37 = -(uint)(fVar76 == local_358) & auVar125._0_4_;
      uVar38 = -(uint)(fVar77 == fStack_354) & auVar125._4_4_;
      uVar39 = -(uint)(fVar74 == fStack_350) & auVar125._8_4_;
      uVar112 = -(uint)(fVar75 == fStack_34c) & auVar125._12_4_;
      local_68 = local_1d8 * fVar113;
      fStack_64 = fStack_1d4 * fVar118;
      fStack_60 = fStack_1d0 * fVar120;
      fStack_5c = fStack_1cc * fVar122;
      local_88 = local_1d8 * fVar132;
      fStack_84 = fStack_1d4 * fVar137;
      fStack_80 = fStack_1d0 * fVar139;
      fStack_7c = fStack_1cc * fVar141;
      fVar55 = auVar104._0_4_;
      fVar56 = auVar104._4_4_;
      fVar58 = auVar104._8_4_;
      fVar71 = auVar104._12_4_;
      local_78 = fVar142 * fVar132;
      fStack_74 = fVar144 * fVar137;
      fStack_70 = fVar145 * fVar139;
      fStack_6c = fVar146 * fVar141;
      local_a8 = -local_1d8;
      fStack_a4 = -fStack_1d4;
      fStack_a0 = -fStack_1d0;
      fStack_9c = -fStack_1cc;
      local_98 = -fVar142;
      fStack_94 = -fVar144;
      fStack_90 = -fVar145;
      fStack_8c = -fVar146;
      fVar78 = -fVar158;
      fVar79 = -fVar161;
      local_378 = CONCAT44(fVar155,fVar152) ^ 0x8000000080000000;
      auVar127._0_4_ = ~uVar81 & ((uint)-local_1d8 & uVar37 | ~uVar37 & (uint)local_1d8);
      auVar127._4_4_ = ~uVar85 & ((uint)-fStack_1d4 & uVar38 | ~uVar38 & (uint)fStack_1d4);
      auVar127._8_4_ = ~uVar87 & ((uint)-fStack_1d0 & uVar39 | ~uVar39 & (uint)fStack_1d0);
      auVar127._12_4_ = ~uVar89 & ((uint)-fStack_1cc & uVar112 | ~uVar112 & (uint)fStack_1cc);
      auVar62._0_4_ =
           (uint)(((local_308 * fVar76 + fVar131) * local_c8 + local_1d8 * fVar113) -
                 local_1d8 * fVar132 * fVar55) & uVar81;
      auVar62._4_4_ =
           (uint)(((local_308 * fVar77 + fVar136) * fStack_c4 + fStack_1d4 * fVar118) -
                 fStack_1d4 * fVar137 * fVar56) & uVar85;
      auVar62._8_4_ =
           (uint)(((local_308 * fVar74 + fVar138) * fStack_c0 + fStack_1d0 * fVar120) -
                 fStack_1d0 * fVar139 * fVar58) & uVar87;
      auVar62._12_4_ =
           (uint)(((local_308 * fVar75 + fVar140) * fStack_bc + fStack_1cc * fVar122) -
                 fStack_1cc * fVar141 * fVar71) & uVar89;
      auVar105._0_4_ = (uint)(fVar55 * fVar40) & uVar81;
      auVar105._4_4_ = (uint)(fVar56 * fVar150) & uVar85;
      auVar105._8_4_ = (uint)(fVar58 * fVar53) & uVar87;
      auVar105._12_4_ = (uint)(fVar71 * fVar54) & uVar89;
      local_58 = ~uVar37 & 0x3f800000;
      uStack_54 = ~uVar38 & 0x3f800000;
      uStack_50 = ~uVar39 & 0x3f800000;
      uStack_4c = ~uVar112 & 0x3f800000;
      auVar82._0_4_ = ~uVar81 & ~uVar37 & 0x3f800000;
      auVar82._4_4_ = ~uVar85 & ~uVar38 & 0x3f800000;
      auVar82._8_4_ = ~uVar87 & ~uVar39 & 0x3f800000;
      auVar82._12_4_ = ~uVar89 & ~uVar112 & 0x3f800000;
      local_1a8._0_4_ = local_248 + fVar76;
      local_1a8._4_4_ = fStack_244 + fVar77;
      fStack_1a0 = fStack_240 + fVar74;
      fStack_19c = fStack_23c + fVar75;
      local_1c8 = auVar82 | auVar105;
      local_1b8 = 0;
      uStack_1b0 = 0;
      local_198 = auVar62 | auVar127;
      local_188._4_4_ =
           (uint)(((fVar57 * fVar77 + fVar154) * fStack_c4 + fStack_224) -
                 fVar144 * fVar137 * fVar56) & uVar85 |
           ~uVar85 & ((uint)-fVar144 & uVar38 | ~uVar38 & (uint)fVar144);
      local_188._0_4_ =
           (uint)(((fVar57 * fVar76 + fVar151) * local_c8 + local_228) - fVar142 * fVar132 * fVar55)
           & uVar81 | ~uVar81 & ((uint)-fVar142 & uVar37 | ~uVar37 & (uint)fVar142);
      local_188._8_4_ =
           (uint)(((fVar57 * fVar74 + fVar157) * fStack_c0 + fStack_220) -
                 fVar145 * fVar139 * fVar58) & uVar87 |
           ~uVar87 & ((uint)-fVar145 & uVar39 | ~uVar39 & (uint)fVar145);
      local_188._12_4_ =
           (uint)(((fVar57 * fVar75 + fVar160) * fStack_bc + fStack_21c) -
                 fVar146 * fVar141 * fVar71) & uVar89 |
           ~uVar89 & ((uint)-fVar146 & uVar112 | ~uVar112 & (uint)fVar146);
      local_178._4_4_ =
           (uint)(((fVar41 * fVar77 + fStack_1e4) * fStack_c4 + fVar68) - fStack_1f4 * fVar56) &
           uVar85 | ~uVar85 & ((uint)-fVar155 & uVar38 | ~uVar38 & (uint)fVar155);
      local_178._0_4_ =
           (uint)(((fVar41 * fVar76 + local_1e8) * local_c8 + fVar67) - local_1f8 * fVar55) & uVar81
           | ~uVar81 & ((uint)-fVar152 & uVar37 | ~uVar37 & (uint)fVar152);
      local_178._8_4_ =
           (uint)(((fVar41 * fVar74 + fStack_1e0) * fStack_c0 + fVar69) - fStack_1f0 * fVar58) &
           uVar87 | ~uVar87 & ((uint)fVar78 & uVar39 | ~uVar39 & (uint)fVar158);
      local_178._12_4_ =
           (uint)(((fVar41 * fVar75 + fStack_1dc) * fStack_bc + fVar70) - fStack_1ec * fVar71) &
           uVar89 | ~uVar89 & ((uint)fVar79 & uVar112 | ~uVar112 & (uint)fVar161);
      uVar33 = (ulong)(uVar36 & 0xff);
      lVar31 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      pSVar29 = local_320;
      fVar55 = fVar41;
      fVar56 = fVar41;
      fVar58 = fVar41;
      local_318 = fVar111;
      fStack_314 = fVar42;
      fStack_310 = fVar43;
      fStack_30c = fVar52;
      fStack_304 = local_308;
      fStack_300 = local_308;
      fStack_2fc = local_308;
      local_2f8 = fVar41;
      fStack_2f4 = fVar41;
      fStack_2f0 = fVar41;
      fStack_2ec = fVar41;
      local_298 = fVar151;
      fStack_294 = fVar154;
      fStack_290 = fVar157;
      fStack_28c = fVar160;
      local_288 = fVar131;
      fStack_284 = fVar136;
      fStack_280 = fVar138;
      fStack_27c = fVar140;
      local_278 = fVar152;
      fStack_274 = fVar155;
      fStack_270 = fVar158;
      fStack_26c = fVar161;
      local_260 = line;
      local_238 = fVar142;
      fStack_234 = fVar144;
      fStack_230 = fVar145;
      fStack_22c = fVar146;
      do {
        local_2e8.hit = (RTCHitN *)&local_168;
        uVar21 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        local_108 = local_b8[uVar21];
        pGVar20 = (pSVar29->geometries).items[(uint)local_108].ptr;
        pRVar25 = (RTCIntersectArguments *)(ulong)*(uint *)(ray + k * 4 + 0x90);
        local_2e8.ray = (RTCRayN *)ray;
        if ((pGVar20->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          uVar33 = uVar33 ^ 1L << (uVar21 & 0x3f);
          bVar34 = true;
        }
        else {
          pRVar25 = context->args;
          if ((pRVar25->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar20->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            bVar34 = false;
          }
          else {
            local_248 = *(float *)(ray + k * 4 + 0x80);
            uVar17 = *(undefined4 *)(local_1c8 + uVar21 * 4);
            local_128._4_4_ = *(undefined4 *)((long)&local_1b8 + uVar21 * 4);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a8 + uVar21 * 4);
            local_2e8.context = context->user;
            local_118 = (local_260->primIDs).field_0.i[uVar21];
            local_138._4_4_ = uVar17;
            local_138._0_4_ = uVar17;
            local_138._8_4_ = uVar17;
            local_138._12_4_ = uVar17;
            local_168 = *(undefined4 *)(local_198 + uVar21 * 4);
            uVar17 = *(undefined4 *)(local_188 + uVar21 * 4);
            local_148 = *(undefined4 *)(local_178 + uVar21 * 4);
            local_158._4_4_ = uVar17;
            local_158._0_4_ = uVar17;
            local_158._8_4_ = uVar17;
            local_158._12_4_ = uVar17;
            uStack_164 = local_168;
            uStack_160 = local_168;
            uStack_15c = local_168;
            uStack_144 = local_148;
            uStack_140 = local_148;
            uStack_13c = local_148;
            local_128._0_4_ = local_128._4_4_;
            local_128._8_4_ = local_128._4_4_;
            local_128._12_4_ = local_128._4_4_;
            uStack_114 = local_118;
            uStack_110 = local_118;
            uStack_10c = local_118;
            fStack_104 = local_108;
            fStack_100 = local_108;
            fStack_fc = local_108;
            uStack_f4 = (local_2e8.context)->instID[0];
            local_f8 = uStack_f4;
            uStack_f0 = uStack_f4;
            uStack_ec = uStack_f4;
            uStack_e4 = (local_2e8.context)->instPrimID[0];
            local_e8 = uStack_e4;
            uStack_e0 = uStack_e4;
            uStack_dc = uStack_e4;
            local_338 = *(undefined8 *)(mm_lookupmask_ps + lVar31);
            uStack_330 = *(undefined8 *)(mm_lookupmask_ps + lVar31 + 8);
            local_2e8.valid = (int *)&local_338;
            local_2e8.geometryUserPtr = pGVar20->userPtr;
            local_2e8.N = 4;
            p_Var27 = pGVar20->occlusionFilterN;
            local_d8 = fVar40;
            fStack_d4 = fVar150;
            fStack_d0 = fVar53;
            fStack_cc = fVar54;
            if (p_Var27 != (RTCFilterFunctionN)0x0) {
              p_Var27 = (RTCFilterFunctionN)(*p_Var27)(&local_2e8);
              pSVar29 = local_320;
              fVar131 = local_288;
              fVar136 = fStack_284;
              fVar138 = fStack_280;
              fVar140 = fStack_27c;
              fVar142 = local_238;
              fVar144 = fStack_234;
              fVar145 = fStack_230;
              fVar146 = fStack_22c;
              fVar152 = local_278;
              fVar155 = fStack_274;
              fVar158 = fStack_270;
              fVar161 = fStack_26c;
              fVar41 = local_2f8;
              fVar55 = fStack_2f4;
              fVar56 = fStack_2f0;
              fVar58 = fStack_2ec;
              fVar111 = local_318;
              fVar42 = fStack_314;
              fVar43 = fStack_310;
              fVar52 = fStack_30c;
              fVar151 = local_298;
              fVar154 = fStack_294;
              fVar157 = fStack_290;
              fVar160 = fStack_28c;
            }
            auVar46._8_4_ = 0xffffffff;
            auVar46._0_8_ = 0xffffffffffffffff;
            auVar46._12_4_ = 0xffffffff;
            auVar45._0_4_ = -(uint)((int)local_338 == 0);
            auVar45._4_4_ = -(uint)(local_338._4_4_ == 0);
            auVar45._8_4_ = -(uint)((int)uStack_330 == 0);
            auVar45._12_4_ = -(uint)(uStack_330._4_4_ == 0);
            uVar36 = movmskps((int)p_Var27,auVar45);
            pRVar26 = (RTCRayN *)(ulong)(uVar36 ^ 0xf);
            if ((uVar36 ^ 0xf) == 0) {
              auVar46 = auVar45 ^ auVar46;
            }
            else {
              p_Var27 = context->args->filter;
              if ((p_Var27 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar20->field_8).field_0x2 & 0x40) != 0))))
              {
                (*p_Var27)(&local_2e8);
                auVar46._8_4_ = 0xffffffff;
                auVar46._0_8_ = 0xffffffffffffffff;
                auVar46._12_4_ = 0xffffffff;
                pSVar29 = local_320;
                fVar131 = local_288;
                fVar136 = fStack_284;
                fVar138 = fStack_280;
                fVar140 = fStack_27c;
                fVar142 = local_238;
                fVar144 = fStack_234;
                fVar145 = fStack_230;
                fVar146 = fStack_22c;
                fVar152 = local_278;
                fVar155 = fStack_274;
                fVar158 = fStack_270;
                fVar161 = fStack_26c;
                fVar41 = local_2f8;
                fVar55 = fStack_2f4;
                fVar56 = fStack_2f0;
                fVar58 = fStack_2ec;
                fVar111 = local_318;
                fVar42 = fStack_314;
                fVar43 = fStack_310;
                fVar52 = fStack_30c;
                fVar151 = local_298;
                fVar154 = fStack_294;
                fVar157 = fStack_290;
                fVar160 = fStack_28c;
              }
              auVar63._0_4_ = -(uint)((int)local_338 == 0);
              auVar63._4_4_ = -(uint)(local_338._4_4_ == 0);
              auVar63._8_4_ = -(uint)((int)uStack_330 == 0);
              auVar63._12_4_ = -(uint)(uStack_330._4_4_ == 0);
              auVar46 = auVar63 ^ auVar46;
              *(undefined1 (*) [16])(local_2e8.ray + 0x80) =
                   ~auVar63 & _DAT_01feba00 | *(undefined1 (*) [16])(local_2e8.ray + 0x80) & auVar63
              ;
              pRVar26 = local_2e8.ray;
            }
            auVar47._0_4_ = auVar46._0_4_ << 0x1f;
            auVar47._4_4_ = auVar46._4_4_ << 0x1f;
            auVar47._8_4_ = auVar46._8_4_ << 0x1f;
            auVar47._12_4_ = auVar46._12_4_ << 0x1f;
            uVar36 = movmskps((int)pRVar26,auVar47);
            pRVar25 = (RTCIntersectArguments *)(ulong)uVar36;
            bVar34 = uVar36 == 0;
            fVar40 = local_d8;
            fVar150 = fStack_d4;
            fVar53 = fStack_d0;
            fVar54 = fStack_cc;
            if (bVar34) {
              *(float *)(ray + k * 4 + 0x80) = local_248;
              uVar33 = uVar33 ^ 1L << (uVar21 & 0x3f);
            }
          }
        }
      } while ((bVar34 != false) && (uVar33 != 0));
      fVar71 = *(float *)(ray + k * 4 + 0x80);
      auVar48._0_4_ = local_208 & local_2a8._0_4_ & -(uint)(fVar111 <= fVar71);
      auVar48._4_4_ = uStack_204 & local_2a8._4_4_ & -(uint)(fVar42 <= fVar71);
      auVar48._8_4_ = uStack_200 & local_2a8._8_4_ & -(uint)(fVar43 <= fVar71);
      auVar48._12_4_ = uStack_1fc & local_2a8._12_4_ & -(uint)(fVar52 <= fVar71);
      uVar36 = movmskps((int)pRVar25,auVar48);
      if (uVar36 == 0) {
        return (bool)(bVar34 ^ 1U);
      }
      uVar81 = -(uint)((float)local_218._0_4_ != (float)local_48._0_4_ &&
                      (float)local_2b8._0_4_ != (float)local_48._0_4_);
      uVar85 = -(uint)((float)local_218._4_4_ != (float)local_48._4_4_ &&
                      (float)local_2b8._4_4_ != (float)local_48._4_4_);
      uVar87 = -(uint)(fStack_210 != fStack_40 && fStack_2b0 != fStack_40);
      uVar89 = -(uint)(fStack_20c != fStack_3c && fStack_2ac != fStack_3c);
      uVar37 = -(uint)(local_358 != (float)local_48._0_4_);
      uVar38 = -(uint)(fStack_354 != (float)local_48._4_4_);
      uVar39 = -(uint)(fStack_350 != fStack_40);
      uVar112 = -(uint)(fStack_34c != fStack_3c);
      auVar49._0_4_ =
           ~uVar81 & (uint)((local_68 + (fVar131 + local_308 * (float)local_48._0_4_) * local_c8) -
                           local_88 * local_258);
      auVar49._4_4_ =
           ~uVar85 & (uint)((fStack_64 + (fVar136 + fStack_304 * (float)local_48._4_4_) * fStack_c4)
                           - fStack_84 * fStack_254);
      auVar49._8_4_ =
           ~uVar87 & (uint)((fStack_60 + (fVar138 + fStack_300 * fStack_40) * fStack_c0) -
                           fStack_80 * fStack_250);
      auVar49._12_4_ =
           ~uVar89 & (uint)((fStack_5c + (fVar140 + fStack_2fc * fStack_3c) * fStack_bc) -
                           fStack_7c * fStack_24c);
      auVar64._0_4_ = ((uint)local_1d8 & uVar37 | ~uVar37 & (uint)local_a8) & uVar81;
      auVar64._4_4_ = ((uint)fStack_1d4 & uVar38 | ~uVar38 & (uint)fStack_a4) & uVar85;
      auVar64._8_4_ = ((uint)fStack_1d0 & uVar39 | ~uVar39 & (uint)fStack_a0) & uVar87;
      auVar64._12_4_ = ((uint)fStack_1cc & uVar112 | ~uVar112 & (uint)fStack_9c) & uVar89;
      auVar65._0_4_ =
           ~uVar81 & (uint)((local_228 + (fVar151 + fVar57 * (float)local_48._0_4_) * local_c8) -
                           local_78 * local_258);
      auVar65._4_4_ =
           ~uVar85 & (uint)((fStack_224 + (fVar154 + fVar57 * (float)local_48._4_4_) * fStack_c4) -
                           fStack_74 * fStack_254);
      auVar65._8_4_ =
           ~uVar87 & (uint)((fStack_220 + (fVar157 + fVar57 * fStack_40) * fStack_c0) -
                           fStack_70 * fStack_250);
      auVar65._12_4_ =
           ~uVar89 & (uint)((fStack_21c + (fVar160 + fVar57 * fStack_3c) * fStack_bc) -
                           fStack_6c * fStack_24c);
      auVar134._0_4_ = ((uint)fVar142 & uVar37 | ~uVar37 & (uint)local_98) & uVar81;
      auVar134._4_4_ = ((uint)fVar144 & uVar38 | ~uVar38 & (uint)fStack_94) & uVar85;
      auVar134._8_4_ = ((uint)fVar145 & uVar39 | ~uVar39 & (uint)fStack_90) & uVar87;
      auVar134._12_4_ = ((uint)fVar146 & uVar112 | ~uVar112 & (uint)fStack_8c) & uVar89;
      auVar73._0_4_ =
           ~uVar81 & (uint)((fVar67 + (local_1e8 + fVar41 * (float)local_48._0_4_) * local_c8) -
                           local_1f8 * local_258);
      auVar73._4_4_ =
           ~uVar85 & (uint)((fVar68 + (fStack_1e4 + fVar55 * (float)local_48._4_4_) * fStack_c4) -
                           fStack_1f4 * fStack_254);
      auVar73._8_4_ =
           ~uVar87 & (uint)((fVar69 + (fStack_1e0 + fVar56 * fStack_40) * fStack_c0) -
                           fStack_1f0 * fStack_250);
      auVar73._12_4_ =
           ~uVar89 & (uint)((fVar70 + (fStack_1dc + fVar58 * fStack_3c) * fStack_bc) -
                           fStack_1ec * fStack_24c);
      auVar83._0_4_ = (~uVar37 & (uint)local_378 | (uint)fVar152 & uVar37) & uVar81;
      auVar83._4_4_ = (~uVar38 & local_378._4_4_ | (uint)fVar155 & uVar38) & uVar85;
      auVar83._8_4_ = (~uVar39 & (uint)fVar78 | (uint)fVar158 & uVar39) & uVar87;
      auVar83._12_4_ = (~uVar112 & (uint)fVar79 | (uint)fVar161 & uVar112) & uVar89;
      local_1c8._4_4_ = ~uVar85 & (uint)(fVar150 * fStack_254) | uStack_54 & uVar85;
      local_1c8._0_4_ = ~uVar81 & (uint)(fVar40 * local_258) | local_58 & uVar81;
      local_1c8._8_4_ = ~uVar87 & (uint)(fVar53 * fStack_250) | uStack_50 & uVar87;
      local_1c8._12_4_ = ~uVar89 & (uint)(fVar54 * fStack_24c) | uStack_4c & uVar89;
      local_1b8 = 0;
      uStack_1b0 = 0;
      local_1a8._4_4_ = fVar42;
      local_1a8._0_4_ = fVar111;
      fStack_1a0 = fVar43;
      fStack_19c = fVar52;
      local_198 = auVar49 | auVar64;
      local_188 = auVar65 | auVar134;
      local_178 = auVar73 | auVar83;
      pSVar29 = context->scene;
      uVar33 = (ulong)(uVar36 & 0xff);
      lVar31 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      auVar135._8_4_ = 0xffffffff;
      auVar135._0_8_ = 0xffffffffffffffff;
      auVar135._12_4_ = 0xffffffff;
      local_268 = k;
      do {
        local_2e8.hit = (RTCHitN *)&local_168;
        uVar21 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
          }
        }
        local_108 = local_b8[uVar21];
        pGVar20 = (pSVar29->geometries).items[(uint)local_108].ptr;
        if ((pGVar20->mask & *(uint *)(ray + local_268 * 4 + 0x90)) == 0) {
          uVar33 = uVar33 ^ 1L << (uVar21 & 0x3f);
          bVar35 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar20->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar35 = false;
        }
        else {
          uVar17 = *(undefined4 *)(ray + local_268 * 4 + 0x80);
          uVar18 = *(undefined4 *)(local_1c8 + uVar21 * 4);
          uVar19 = *(undefined4 *)((long)&local_1b8 + uVar21 * 4);
          *(undefined4 *)(ray + local_268 * 4 + 0x80) = *(undefined4 *)(local_1a8 + uVar21 * 4);
          local_2e8.context = context->user;
          local_118 = (local_260->primIDs).field_0.i[uVar21];
          local_138._4_4_ = uVar18;
          local_138._0_4_ = uVar18;
          local_138._8_4_ = uVar18;
          local_138._12_4_ = uVar18;
          local_128._4_4_ = uVar19;
          local_128._0_4_ = uVar19;
          local_128._8_4_ = uVar19;
          local_128._12_4_ = uVar19;
          local_168 = *(undefined4 *)(local_198 + uVar21 * 4);
          local_158._4_4_ = *(undefined4 *)(local_188 + uVar21 * 4);
          local_148 = *(undefined4 *)(local_178 + uVar21 * 4);
          uStack_164 = local_168;
          uStack_160 = local_168;
          uStack_15c = local_168;
          local_158._0_4_ = local_158._4_4_;
          local_158._8_4_ = local_158._4_4_;
          local_158._12_4_ = local_158._4_4_;
          uStack_144 = local_148;
          uStack_140 = local_148;
          uStack_13c = local_148;
          uStack_114 = local_118;
          uStack_110 = local_118;
          uStack_10c = local_118;
          fStack_104 = local_108;
          fStack_100 = local_108;
          fStack_fc = local_108;
          uStack_f4 = (local_2e8.context)->instID[0];
          local_f8 = uStack_f4;
          uStack_f0 = uStack_f4;
          uStack_ec = uStack_f4;
          uStack_e4 = (local_2e8.context)->instPrimID[0];
          local_e8 = uStack_e4;
          uStack_e0 = uStack_e4;
          uStack_dc = uStack_e4;
          local_338 = *(undefined8 *)(mm_lookupmask_ps + lVar31);
          uStack_330 = *(undefined8 *)(mm_lookupmask_ps + lVar31 + 8);
          local_2e8.valid = (int *)&local_338;
          local_2e8.geometryUserPtr = pGVar20->userPtr;
          local_2e8.N = 4;
          p_Var27 = pGVar20->occlusionFilterN;
          local_2e8.ray = (RTCRayN *)ray;
          if (p_Var27 != (RTCFilterFunctionN)0x0) {
            p_Var27 = (RTCFilterFunctionN)(*p_Var27)(&local_2e8);
            auVar135._8_4_ = 0xffffffff;
            auVar135._0_8_ = 0xffffffffffffffff;
            auVar135._12_4_ = 0xffffffff;
          }
          auVar50._0_4_ = -(uint)((int)local_338 == 0);
          auVar50._4_4_ = -(uint)(local_338._4_4_ == 0);
          auVar50._8_4_ = -(uint)((int)uStack_330 == 0);
          auVar50._12_4_ = -(uint)(uStack_330._4_4_ == 0);
          uVar36 = movmskps((int)p_Var27,auVar50);
          pRVar26 = (RTCRayN *)(ulong)(uVar36 ^ 0xf);
          if ((uVar36 ^ 0xf) == 0) {
            auVar50 = auVar50 ^ auVar135;
          }
          else {
            p_Var27 = context->args->filter;
            if ((p_Var27 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar20->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var27)(&local_2e8);
              auVar135._8_4_ = 0xffffffff;
              auVar135._0_8_ = 0xffffffffffffffff;
              auVar135._12_4_ = 0xffffffff;
            }
            auVar66._0_4_ = -(uint)((int)local_338 == 0);
            auVar66._4_4_ = -(uint)(local_338._4_4_ == 0);
            auVar66._8_4_ = -(uint)((int)uStack_330 == 0);
            auVar66._12_4_ = -(uint)(uStack_330._4_4_ == 0);
            auVar50 = auVar66 ^ auVar135;
            *(undefined1 (*) [16])(local_2e8.ray + 0x80) =
                 ~auVar66 & _DAT_01feba00 | *(undefined1 (*) [16])(local_2e8.ray + 0x80) & auVar66;
            pRVar26 = local_2e8.ray;
          }
          auVar51._0_4_ = auVar50._0_4_ << 0x1f;
          auVar51._4_4_ = auVar50._4_4_ << 0x1f;
          auVar51._8_4_ = auVar50._8_4_ << 0x1f;
          auVar51._12_4_ = auVar50._12_4_ << 0x1f;
          iVar30 = movmskps((int)pRVar26,auVar51);
          bVar35 = iVar30 == 0;
          if (bVar35) {
            *(undefined4 *)(ray + local_268 * 4 + 0x80) = uVar17;
            uVar33 = uVar33 ^ 1L << (uVar21 & 0x3f);
          }
        }
      } while ((bVar35 != false) && (uVar33 != 0));
      return (bool)(bVar34 ^ 1U | bVar35 ^ 1U);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }